

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O2

void satoko_assump_push(solver_t *s,int lit)

{
  if ((uint)lit >> 1 < s->assigns->size) {
    vec_uint_push_back(s->assumptions,lit);
    vec_char_assign(s->polarity,(uint)lit >> 1,(byte)lit & 1);
    return;
  }
  __assert_fail("lit2var(lit) < (unsigned)satoko_varnum(s)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/solver_api.c"
                ,300,"void satoko_assump_push(solver_t *, int)");
}

Assistant:

void satoko_assump_push(solver_t *s, int lit)
{
    assert(lit2var(lit) < (unsigned)satoko_varnum(s));
    // printf("[Satoko] Push assumption: %d\n", lit);
    vec_uint_push_back(s->assumptions, lit);
    vec_char_assign(s->polarity, lit2var(lit), lit_polarity(lit));
}